

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::statistics(tetgenmesh *this)

{
  uint uVar1;
  tetgenbehavior *ptVar2;
  tetgenio *ptVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  
  puts("\nStatistics:\n");
  printf("  Input points: %d\n",(ulong)(uint)this->in->numberofpoints);
  if (this->b->refine == 0) {
    if (this->b->plc != 0) {
      printf("  Input facets: %d\n",(ulong)(uint)this->in->numberoffacets);
      printf("  Input segments: %ld\n",this->insegments);
      ptVar3 = this->in;
      if (0 < ptVar3->numberofedges) {
        printf("  Input edges: %d\n");
        ptVar3 = this->in;
      }
      printf("  Input holes: %d\n",(ulong)(uint)ptVar3->numberofholes);
      uVar1 = this->in->numberofregions;
      pcVar6 = "  Input regions: %d\n";
      goto LAB_00149125;
    }
  }
  else {
    printf("  Input tetrahedra: %d\n",(ulong)(uint)this->in->numberoftetrahedra);
    ptVar3 = this->in;
    if (0 < ptVar3->numberoftrifaces) {
      printf("  Input triangles: %d\n");
      ptVar3 = this->in;
    }
    uVar1 = ptVar3->numberofedges;
    if (0 < (int)uVar1) {
      pcVar6 = "  Input edges: %d\n";
LAB_00149125:
      printf(pcVar6,(ulong)uVar1);
    }
  }
  uVar8 = this->tetrahedrons->items - this->hullsize;
  lVar7 = this->hullsize + uVar8 * 4;
  lVar4 = lVar7 / 2;
  if (this->b->weighted == 0) {
    lVar5 = 0;
  }
  else {
    lVar5 = this->nonregularcount;
  }
  printf("\n  Mesh points: %ld\n",this->points->items - lVar5,lVar7 % 2);
  printf("  Mesh tetrahedra: %ld\n",uVar8);
  printf("  Mesh faces: %ld\n",lVar4);
  lVar7 = this->meshedges;
  if (lVar7 < 1) {
    if (this->nonconvex == 0) {
      if (this->b->weighted == 0) {
        lVar7 = 0;
      }
      else {
        lVar7 = this->nonregularcount;
      }
      lVar7 = (lVar4 + ~uVar8 + this->points->items) - (this->dupverts + this->unuverts + lVar7);
      this->meshedges = lVar7;
      goto LAB_001491a9;
    }
  }
  else {
LAB_001491a9:
    printf("  Mesh edges: %ld\n",lVar7);
  }
  if ((this->b->plc == 0) && (this->b->refine == 0)) {
    printf("  Convex hull faces: %ld\n",this->hullsize);
    if (this->meshhulledges < 1) goto LAB_00149282;
    pcVar6 = "  Convex hull edges: %ld\n";
  }
  else {
    printf("  Mesh faces on exterior boundary: %ld\n",this->hullsize);
    if (0 < this->meshhulledges) {
      printf("  Mesh edges on exterior boundary: %ld\n");
    }
    printf("  Mesh faces on input facets: %ld\n",this->subfaces->items);
    printf("  Mesh edges on input segments: %ld\n",this->subsegs->items);
    if (0 < this->st_facref_count) {
      printf("  Steiner points on input facets:  %ld\n");
    }
    if (0 < this->st_segref_count) {
      printf("  Steiner points on input segments:  %ld\n");
    }
    if (this->st_volref_count < 1) goto LAB_00149282;
    pcVar6 = "  Steiner points inside domain: %ld\n";
  }
  printf(pcVar6);
LAB_00149282:
  if (this->b->weighted != 0) {
    printf("  Skipped non-regular points: %ld\n",this->nonregularcount);
  }
  putchar(10);
  ptVar2 = this->b;
  if (0 < ptVar2->verbose) {
    if (((ptVar2->plc != 0) || (ptVar2->refine != 0)) && (0 < this->tetrahedrons->items)) {
      qualitystatistics(this);
    }
    if (0 < this->tetrahedrons->items) {
      memorystatistics(this);
      return;
    }
  }
  return;
}

Assistant:

void tetgenmesh::statistics()
{
  long tetnumber, facenumber;

  printf("\nStatistics:\n\n");
  printf("  Input points: %d\n", in->numberofpoints);
  if (b->refine) {
    printf("  Input tetrahedra: %d\n", in->numberoftetrahedra);
    if (in->numberoftrifaces > 0) {
	  printf("  Input triangles: %d\n", in->numberoftrifaces);
    }
    if (in->numberofedges > 0) {
	  printf("  Input edges: %d\n", in->numberofedges);
	}
  } else if (b->plc) {
    printf("  Input facets: %d\n", in->numberoffacets);
    printf("  Input segments: %ld\n", insegments);
	if (in->numberofedges > 0) {
	  printf("  Input edges: %d\n", in->numberofedges);
	}
    printf("  Input holes: %d\n", in->numberofholes);
    printf("  Input regions: %d\n", in->numberofregions);
  }

  tetnumber = tetrahedrons->items - hullsize;
  facenumber = (tetnumber * 4l + hullsize) / 2l;

  if (b->weighted) { // -w option
    printf("\n  Mesh points: %ld\n", points->items - nonregularcount);
  } else {
    printf("\n  Mesh points: %ld\n", points->items);
  }
  printf("  Mesh tetrahedra: %ld\n", tetnumber);
  printf("  Mesh faces: %ld\n", facenumber);
  if (meshedges > 0l) {
    printf("  Mesh edges: %ld\n", meshedges);
  } else {
    if (!nonconvex) {
      long vsize = points->items - dupverts - unuverts;
      if (b->weighted) vsize -= nonregularcount;
      meshedges = vsize + facenumber - tetnumber - 1;
      printf("  Mesh edges: %ld\n", meshedges);
    }
  }

  if (b->plc || b->refine) {
    printf("  Mesh faces on exterior boundary: %ld\n", hullsize);
    if (meshhulledges > 0l) {
      printf("  Mesh edges on exterior boundary: %ld\n", meshhulledges);
    }
    printf("  Mesh faces on input facets: %ld\n", subfaces->items);
    printf("  Mesh edges on input segments: %ld\n", subsegs->items);
    if (st_facref_count > 0l) {
      printf("  Steiner points on input facets:  %ld\n", st_facref_count);
    }
    if (st_segref_count > 0l) {
      printf("  Steiner points on input segments:  %ld\n", st_segref_count);
    }
    if (st_volref_count > 0l) {
      printf("  Steiner points inside domain: %ld\n", st_volref_count);
    }
  } else {
    printf("  Convex hull faces: %ld\n", hullsize);
    if (meshhulledges > 0l) {
      printf("  Convex hull edges: %ld\n", meshhulledges);
    }
  }
  if (b->weighted) { // -w option
    printf("  Skipped non-regular points: %ld\n", nonregularcount);
  }
  printf("\n");


  if (b->verbose > 0) {
    if (b->plc || b->refine) { // -p or -r
      if (tetrahedrons->items > 0l) {
        qualitystatistics();
      }
    }
    if (tetrahedrons->items > 0l) {
      memorystatistics();
    }
  }
}